

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  void *in_RCX;
  ImFontConfig font_cfg;
  undefined1 local_b0 [16];
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImFontConfig *in_stack_ffffffffffffff98;
  ImFontAtlas *in_stack_ffffffffffffffa0;
  
  if (in_RCX == (void *)0x0) {
    ImFontConfig::ImFontConfig
              ((ImFontConfig *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  else {
    memcpy(local_b0,in_RCX,0x88);
  }
  pIVar1 = AddFont(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}